

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O3

void __thiscall
S2Builder::EdgeChainSimplifier::MergeChain
          (EdgeChainSimplifier *this,vector<int,_std::allocator<int>_> *vertices)

{
  pointer *pppVar1;
  vector<int,std::allocator<int>> *pvVar2;
  ulong *puVar3;
  int iVar4;
  iterator iVar5;
  iterator iVar6;
  pair<int,_int> pVar7;
  pair<int,_int> pVar8;
  Iterator piVar9;
  pointer pvVar10;
  pointer piVar11;
  pointer piVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  int *piVar16;
  uint uVar17;
  pointer piVar18;
  pointer ppVar19;
  uint uVar20;
  ostream *poVar21;
  ulong uVar22;
  EdgeId e;
  long lVar23;
  pointer pvVar24;
  EdgeId e_2;
  int iVar25;
  int iVar26;
  vector<int,_std::allocator<int>_> *ids;
  ulong uVar27;
  pair<const_std::pair<int,_int>_*,_const_std::pair<int,_int>_*> pVar28;
  InputEdgeId id;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  merged_input_ids;
  vector<int,_std::allocator<int>_> degenerate_ids;
  IdSet local_d0;
  vector<int,_std::allocator<int>_> *local_b8;
  int local_ac;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_a8;
  EdgeChainSimplifier *local_a0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_98;
  pair<const_std::pair<int,_int>_*,_const_std::pair<int,_int>_*> local_80;
  ulong local_70;
  vector<int,_std::allocator<int>_> local_68;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (vector<int,_std::allocator<int>_> *)0x0;
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (vector<int,_std::allocator<int>_> *)0x0;
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  piVar16 = (vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  piVar18 = (vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  local_b8 = vertices;
  if (4 < (ulong)((long)piVar18 - (long)piVar16)) {
    uVar22 = 1;
    local_a0 = this;
    do {
      uVar20 = piVar16[uVar22 - 1];
      uVar17 = piVar16[uVar22];
      piVar18 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppVar19 = (((this->out_).edges_)->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_start;
      local_40 = (ulong)(int)uVar20;
      local_d0.begin_._0_4_ = uVar20;
      local_d0.begin_._4_4_ = uVar17;
      local_50 = uVar22;
      local_80 = std::
                 __equal_range<std::pair<int,int>const*,std::pair<int,int>,__gnu_cxx::__ops::_Iter_less_val,__gnu_cxx::__ops::_Val_less_iter>
                           (ppVar19 + piVar18[local_40],ppVar19 + piVar18[local_40 + 1],&local_d0);
      piVar18 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppVar19 = (((this->out_).edges_)->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_start;
      local_d0.begin_._0_4_ = uVar17;
      local_d0.begin_._4_4_ = uVar20;
      local_48 = (ulong)uVar20;
      pVar28 = std::
               __equal_range<std::pair<int,int>const*,std::pair<int,int>,__gnu_cxx::__ops::_Iter_less_val,__gnu_cxx::__ops::_Val_less_iter>
                         (ppVar19 + piVar18[(int)uVar17],ppVar19 + piVar18[(long)(int)uVar17 + 1],
                          &local_d0);
      uVar22 = (ulong)((long)local_80.first - (long)ppVar19) >> 3;
      local_80.second = (pair<int,_int> *)((ulong)((long)local_80.second - (long)ppVar19) >> 3);
      ppVar19 = (((this->out_).edges_)->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_start;
      local_38 = (ulong)((long)pVar28.first - (long)ppVar19) >> 3;
      local_a8 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                 ((ulong)((long)pVar28.second - (long)ppVar19) >> 3);
      local_80.first = (pair<int,_int> *)uVar22;
      if (local_50 == 1) {
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::resize(&local_98,
                 (long)((int)local_a8 - (int)local_38) + (long)((int)local_80.second - (int)uVar22))
        ;
        pvVar10 = local_98.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (pvVar24 = local_98.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pvVar24 != pvVar10;
            pvVar24 = pvVar24 + 1) {
          std::vector<int,_std::allocator<int>_>::reserve
                    (pvVar24,((long)(local_b8->super__Vector_base<int,_std::allocator<int>_>).
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_b8->super__Vector_base<int,_std::allocator<int>_>).
                                    _M_impl.super__Vector_impl_data._M_start >> 2) - 1);
        }
      }
      else {
        uVar20 = (uint)local_48;
        uVar17 = uVar20 + 0x3f;
        if (-1 < (int)uVar20) {
          uVar17 = uVar20;
        }
        local_70 = 0x800000000000003f;
        if (((this->is_interior_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
             [(long)((int)uVar17 >> 6) +
              (ulong)((local_40 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
             (local_40 & 0x3f) & 1) == 0) {
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)&local_d0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
                     ,0x6bd,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_d0.end_,"Check failed: is_interior_[v0] ",0x1f);
          goto LAB_001ae369;
        }
        piVar18 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_d0.begin_._0_4_ = uVar20;
        local_d0.begin_._4_4_ = uVar20;
        pVar28 = std::
                 __equal_range<std::pair<int,int>const*,std::pair<int,int>,__gnu_cxx::__ops::_Iter_less_val,__gnu_cxx::__ops::_Val_less_iter>
                           (ppVar19 + piVar18[local_40],ppVar19 + piVar18[local_40 + 1],&local_d0);
        ppVar19 = (((this->out_).edges_)->
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        iVar13 = (int)((ulong)((long)pVar28.first - (long)ppVar19) >> 3);
        iVar14 = (int)((ulong)((long)pVar28.second - (long)ppVar19) >> 3);
        if (iVar13 != iVar14) {
          uVar22 = (ulong)iVar13;
          do {
            IdSetLexicon::id_set
                      (&local_d0,this->g_->input_edge_id_set_lexicon_,
                       (this->g_->input_edge_id_set_ids_->
                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar22]);
            piVar9 = local_d0.end_;
            for (poVar21 = (ostream *)CONCAT44(local_d0.begin_._4_4_,(uint)local_d0.begin_);
                poVar21 != (ostream *)piVar9;
                poVar21 = (ostream *)((long)&poVar21->_vptr_basic_ostream + 4)) {
              local_ac = *(int *)&poVar21->_vptr_basic_ostream;
              if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_68,
                           (iterator)
                           local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_ac);
              }
              else {
                *local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_ac;
                local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
            uVar27 = uVar22 + 0x3f;
            if (-1 < (long)uVar22) {
              uVar27 = uVar22;
            }
            puVar3 = (this->used_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     ((long)uVar27 >> 6) +
                     (ulong)((uVar22 & local_70) < 0x8000000000000001) + 0xffffffffffffffff;
            *puVar3 = *puVar3 | 1L << ((byte)uVar22 & 0x3f);
            uVar22 = uVar22 + 1;
          } while ((int)uVar22 != iVar14);
        }
      }
      uVar22 = 0;
      uVar20 = (int)local_80.second - (int)local_80.first;
      if (uVar20 != 0) {
        uVar27 = (ulong)(int)local_80.first;
        uVar22 = 0;
        do {
          IdSetLexicon::id_set
                    (&local_d0,local_a0->g_->input_edge_id_set_lexicon_,
                     (local_a0->g_->input_edge_id_set_ids_->
                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                     _M_start[uVar27]);
          piVar9 = local_d0.end_;
          for (poVar21 = (ostream *)CONCAT44(local_d0.begin_._4_4_,(uint)local_d0.begin_);
              poVar21 != (ostream *)piVar9;
              poVar21 = (ostream *)((long)&poVar21->_vptr_basic_ostream + 4)) {
            local_ac = *(int *)&poVar21->_vptr_basic_ostream;
            pvVar2 = (vector<int,std::allocator<int>> *)
                     (local_98.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar22);
            iVar5._M_current = *(int **)(pvVar2 + 8);
            if (iVar5._M_current == *(int **)(pvVar2 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (pvVar2,iVar5,&local_ac);
            }
            else {
              *iVar5._M_current = local_ac;
              *(int **)(pvVar2 + 8) = iVar5._M_current + 1;
            }
          }
          uVar15 = uVar27 + 0x3f;
          if (-1 < (long)uVar27) {
            uVar15 = uVar27;
          }
          puVar3 = (local_a0->used_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                   ((long)uVar15 >> 6) +
                   (ulong)((uVar27 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
          *puVar3 = *puVar3 | 1L << ((byte)uVar27 & 0x3f);
          uVar22 = uVar22 + 1;
          uVar27 = uVar27 + 1;
        } while (uVar22 != uVar20);
        uVar22 = (ulong)uVar20;
      }
      this = local_a0;
      if ((int)local_38 != (int)local_a8) {
        uVar27 = (ulong)(int)local_38;
        do {
          IdSetLexicon::id_set
                    (&local_d0,this->g_->input_edge_id_set_lexicon_,
                     (this->g_->input_edge_id_set_ids_->
                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                     _M_start[uVar27]);
          piVar9 = local_d0.end_;
          for (poVar21 = (ostream *)CONCAT44(local_d0.begin_._4_4_,(uint)local_d0.begin_);
              poVar21 != (ostream *)piVar9;
              poVar21 = (ostream *)((long)&poVar21->_vptr_basic_ostream + 4)) {
            local_ac = *(int *)&poVar21->_vptr_basic_ostream;
            pvVar2 = (vector<int,std::allocator<int>> *)
                     (local_98.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar22);
            iVar5._M_current = *(int **)(pvVar2 + 8);
            if (iVar5._M_current == *(int **)(pvVar2 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (pvVar2,iVar5,&local_ac);
            }
            else {
              *iVar5._M_current = local_ac;
              *(int **)(pvVar2 + 8) = iVar5._M_current + 1;
            }
          }
          uVar15 = uVar27 + 0x3f;
          if (-1 < (long)uVar27) {
            uVar15 = uVar27;
          }
          puVar3 = (this->used_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                   ((long)uVar15 >> 6) +
                   (ulong)((uVar27 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
          *puVar3 = *puVar3 | 1L << ((byte)uVar27 & 0x3f);
          uVar22 = uVar22 + 1;
          uVar27 = uVar27 + 1;
        } while ((int)uVar27 != (int)local_a8);
      }
      piVar12 = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      piVar11 = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (((long)local_98.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_98.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
          (uVar22 & 0xffffffff) != 0) {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)&local_d0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
                   ,0x6d7,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_d0.end_,"Check failed: (merged_input_ids.size()) == (j) ",0x2f);
LAB_001ae369:
        abort();
      }
      uVar22 = local_50 + 1;
      piVar16 = (local_b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      piVar18 = (local_b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    } while (uVar22 < (ulong)((long)piVar18 - (long)piVar16 >> 2));
    if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      uVar22 = (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
      lVar23 = 0x3f;
      if (uVar22 != 0) {
        for (; uVar22 >> lVar23 == 0; lVar23 = lVar23 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,((uint)lVar23 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (piVar11,piVar12);
      AssignDegenerateEdges(this,&local_68,&local_98);
      piVar16 = (local_b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      piVar18 = (local_b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    }
  }
  iVar13 = *piVar16;
  iVar14 = piVar16[1];
  iVar4 = piVar18[-1];
  piVar18 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppVar19 = (((this->out_).edges_)->
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_d0.begin_._0_4_ = iVar13;
  local_d0.begin_._4_4_ = iVar14;
  pVar28 = std::
           __equal_range<std::pair<int,int>const*,std::pair<int,int>,__gnu_cxx::__ops::_Iter_less_val,__gnu_cxx::__ops::_Val_less_iter>
                     (ppVar19 + piVar18[iVar13],ppVar19 + piVar18[(long)iVar13 + 1]);
  ppVar19 = (((this->out_).edges_)->
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar26 = (int)((ulong)((long)pVar28.first - (long)ppVar19) >> 3);
  iVar25 = (int)((ulong)((long)pVar28.second - (long)ppVar19) >> 3);
  local_d0.begin_._0_4_ = iVar14;
  if (iVar26 != iVar25) {
    local_70 = CONCAT44(local_70._4_4_,iVar14);
    local_a8 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->new_edges_;
    local_b8 = &this->new_edge_layers_;
    lVar23 = (long)iVar26;
    iVar25 = iVar25 - iVar26;
    do {
      iVar6._M_current =
           (this->new_edges_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_d0.begin_._4_4_ = iVar4;
      if (iVar6._M_current ==
          (this->new_edges_).
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_d0.begin_._0_4_ = iVar13;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_realloc_insert<std::pair<int,int>>(local_a8,iVar6,(pair<int,_int> *)&local_d0);
      }
      else {
        pVar7.second = iVar4;
        pVar7.first = iVar13;
        *iVar6._M_current = pVar7;
        pppVar1 = &(this->new_edges_).
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + 1;
      }
      local_d0.begin_._0_4_ =
           (this->edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar23];
      iVar5._M_current =
           (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (local_b8,iVar5,(int *)&local_d0);
      }
      else {
        *iVar5._M_current = (uint)local_d0.begin_;
        (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      lVar23 = lVar23 + 1;
      iVar25 = iVar25 + -1;
    } while (iVar25 != 0);
    ppVar19 = (((this->out_).edges_)->
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    local_d0.begin_._0_4_ = (int)local_70;
  }
  piVar18 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_d0.begin_._4_4_ = iVar13;
  pVar28 = std::
           __equal_range<std::pair<int,int>const*,std::pair<int,int>,__gnu_cxx::__ops::_Iter_less_val,__gnu_cxx::__ops::_Val_less_iter>
                     (ppVar19 + piVar18[(int)(uint)local_d0.begin_],
                      ppVar19 + piVar18[(long)(int)(uint)local_d0.begin_ + 1]);
  ppVar19 = (((this->out_).edges_)->
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar14 = (int)((ulong)((long)pVar28.first - (long)ppVar19) >> 3);
  iVar26 = (int)((ulong)((long)pVar28.second - (long)ppVar19) >> 3);
  if (iVar14 != iVar26) {
    local_a8 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->new_edges_;
    local_b8 = &this->new_edge_layers_;
    lVar23 = (long)iVar14;
    iVar26 = iVar26 - iVar14;
    do {
      iVar6._M_current =
           (this->new_edges_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->new_edges_).
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_d0.begin_._0_4_ = iVar4;
        local_d0.begin_._4_4_ = iVar13;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_realloc_insert<std::pair<int,int>>(local_a8,iVar6,(pair<int,_int> *)&local_d0);
      }
      else {
        pVar8.second = iVar13;
        pVar8.first = iVar4;
        *iVar6._M_current = pVar8;
        pppVar1 = &(this->new_edges_).
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + 1;
        local_d0.begin_._4_4_ = iVar13;
      }
      local_d0.begin_._0_4_ =
           (this->edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar23];
      iVar5._M_current =
           (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (local_b8,iVar5,(int *)&local_d0);
      }
      else {
        *iVar5._M_current = (uint)local_d0.begin_;
        (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      lVar23 = lVar23 + 1;
      iVar26 = iVar26 + -1;
    } while (iVar26 != 0);
  }
  pvVar10 = local_98.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_98.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_98.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar24 = local_98.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_d0.begin_._0_4_ =
           IdSetLexicon::
           Add<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                     (this->input_edge_id_set_lexicon_,
                      (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                      (pvVar24->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start,
                      (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                      (pvVar24->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish);
      iVar5._M_current =
           (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&this->new_input_edge_ids_,iVar5,(int *)&local_d0);
      }
      else {
        *iVar5._M_current = (uint)local_d0.begin_;
        (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      pvVar24 = pvVar24 + 1;
    } while (pvVar24 != pvVar10);
  }
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_98);
  return;
}

Assistant:

void S2Builder::EdgeChainSimplifier::MergeChain(
    const vector<VertexId>& vertices) {
  // Suppose that all interior vertices have M outgoing edges and N incoming
  // edges.  Our goal is to group the edges into M outgoing chains and N
  // incoming chains, and then replace each chain by a single edge.
  vector<vector<InputEdgeId>> merged_input_ids;
  vector<InputEdgeId> degenerate_ids;
  int num_out;  // Edge count in the outgoing direction.
  for (int i = 1; i < vertices.size(); ++i) {
    VertexId v0 = vertices[i-1];
    VertexId v1 = vertices[i];
    auto out_edges = out_.edge_ids(v0, v1);
    auto in_edges = out_.edge_ids(v1, v0);
    if (i == 1) {
      // Allocate space to store the input edge ids associated with each edge.
      num_out = out_edges.size();
      merged_input_ids.resize(num_out + in_edges.size());
      for (vector<InputEdgeId>& ids : merged_input_ids) {
        ids.reserve(vertices.size() - 1);
      }
    } else {
      // For each interior vertex, we build a list of input edge ids
      // associated with degenerate edges.  Each input edge ids will be
      // assigned to one of the output edges later.  (Normally there are no
      // degenerate edges at all since most layer types don't want them.)
      S2_DCHECK(is_interior_[v0]);
      for (EdgeId e : out_.edge_ids(v0, v0)) {
        for (InputEdgeId id : g_.input_edge_ids(e)) {
          degenerate_ids.push_back(id);
        }
        used_[e] = true;
      }
    }
    // Because the edges were created in layer order, and all sorts used are
    // stable, the edges are still in layer order.  Therefore we can simply
    // merge together all the edges in the same relative position.
    int j = 0;
    for (EdgeId e : out_edges) {
      for (InputEdgeId id : g_.input_edge_ids(e)) {
        merged_input_ids[j].push_back(id);
      }
      used_[e] = true;
      ++j;
    }
    for (EdgeId e : in_edges) {
      for (InputEdgeId id : g_.input_edge_ids(e)) {
        merged_input_ids[j].push_back(id);
      }
      used_[e] = true;
      ++j;
    }
    S2_DCHECK_EQ(merged_input_ids.size(), j);
  }
  if (!degenerate_ids.empty()) {
    std::sort(degenerate_ids.begin(), degenerate_ids.end());
    AssignDegenerateEdges(degenerate_ids, &merged_input_ids);
  }
  // Output the merged edges.
  VertexId v0 = vertices[0], v1 = vertices[1], vb = vertices.back();
  for (EdgeId e : out_.edge_ids(v0, v1)) {
    new_edges_.push_back(Edge(v0, vb));
    new_edge_layers_.push_back(graph_edge_layer(e));
  }
  for (EdgeId e : out_.edge_ids(v1, v0)) {
    new_edges_.push_back(Edge(vb, v0));
    new_edge_layers_.push_back(graph_edge_layer(e));
  }
  for (const auto& ids : merged_input_ids) {
    new_input_edge_ids_.push_back(input_edge_id_set_lexicon_->Add(ids));
  }
}